

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
aeron::archive::util::PropertiesReader::parseLine
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PropertiesReader *this,string *line)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte *pbVar1;
  size_type sVar2;
  pointer pcVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  runtime_error *this_00;
  size_type sVar7;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  string *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  iVar6 = 0;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  sVar2 = line->_M_string_length;
  if (sVar2 == 0) {
    return __return_storage_ptr__;
  }
  s = &__return_storage_ptr__->second;
  pcVar3 = (line->_M_dataplus)._M_p;
  uVar11 = 0;
  sVar7 = 0;
  do {
    uVar9 = (uint)(byte)pcVar3[sVar7];
    if (iVar6 == 1) {
      if (uVar9 == 0x3d) {
        ::std::__cxx11::string::string((string *)&local_50,(string *)line,uVar11,sVar7);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        anon_unknown.dwarf_4214d::rtrim(&__return_storage_ptr__->first);
        uVar11 = sVar7 + 1;
        iVar6 = 2;
      }
      else {
        iVar6 = 1;
        if (uVar9 == 0x23) goto LAB_001349c8;
      }
    }
    else if (iVar6 == 0) {
      iVar5 = isspace(uVar9);
      iVar6 = 0;
      if ((iVar5 == 0) && (iVar6 = 1, uVar11 = sVar7, uVar9 == 0x23)) {
        return __return_storage_ptr__;
      }
    }
    else {
      iVar6 = 2;
      if (uVar9 == 0x23) goto LAB_00134a16;
    }
    sVar7 = sVar7 + 1;
  } while (sVar2 != sVar7);
  sVar7 = sVar2;
  if (iVar6 != 2) {
    if (iVar6 != 1) {
      return __return_storage_ptr__;
    }
LAB_001349c8:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_50,"no value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line);
    ::std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_00134a16:
  ::std::__cxx11::string::string((string *)&local_50,(string *)line,uVar11,sVar7);
  ::std::__cxx11::string::operator=((string *)s,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = (byte *)(__return_storage_ptr__->second)._M_dataplus._M_p;
  uVar11 = (__return_storage_ptr__->second)._M_string_length;
  pbVar1 = pbVar4 + uVar11;
  pbVar10 = pbVar4;
  if (0 < (long)uVar11 >> 2) {
    pbVar10 = pbVar4 + (uVar11 & 0xfffffffffffffffc);
    lVar8 = ((long)uVar11 >> 2) + 1;
    pbVar12 = pbVar4 + 3;
    do {
      iVar6 = isspace((uint)pbVar12[-3]);
      if (iVar6 == 0) {
        pbVar12 = pbVar12 + -3;
        goto LAB_00134b36;
      }
      iVar6 = isspace((uint)pbVar12[-2]);
      if (iVar6 == 0) {
        pbVar12 = pbVar12 + -2;
        goto LAB_00134b36;
      }
      iVar6 = isspace((uint)pbVar12[-1]);
      if (iVar6 == 0) {
        pbVar12 = pbVar12 + -1;
        goto LAB_00134b36;
      }
      iVar6 = isspace((uint)*pbVar12);
      if (iVar6 == 0) goto LAB_00134b36;
      lVar8 = lVar8 + -1;
      pbVar12 = pbVar12 + 4;
    } while (1 < lVar8);
  }
  lVar8 = (long)pbVar1 - (long)pbVar10;
  if (lVar8 == 1) {
LAB_00134b23:
    iVar6 = isspace((uint)*pbVar10);
    pbVar12 = pbVar10;
    if (iVar6 != 0) {
      pbVar12 = pbVar1;
    }
LAB_00134b36:
    if (pbVar1 != pbVar12) {
      ::std::__cxx11::string::_M_erase((ulong)s,0);
      goto LAB_00134b59;
    }
  }
  else {
    if (lVar8 == 2) {
LAB_00134af5:
      iVar6 = isspace((uint)*pbVar10);
      pbVar12 = pbVar10;
      if (iVar6 != 0) {
        pbVar10 = pbVar10 + 1;
        goto LAB_00134b23;
      }
      goto LAB_00134b36;
    }
    if (lVar8 == 3) {
      iVar6 = isspace((uint)*pbVar10);
      pbVar12 = pbVar10;
      if (iVar6 != 0) {
        pbVar10 = pbVar10 + 1;
        goto LAB_00134af5;
      }
      goto LAB_00134b36;
    }
  }
  (__return_storage_ptr__->second)._M_string_length = 0;
  *pbVar4 = 0;
LAB_00134b59:
  anon_unknown.dwarf_4214d::rtrim(s);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> PropertiesReader::parseLine(const std::string& line) {
    enum { START, KEY, VALUE } state;
    state = START;

    std::pair<std::string, std::string> result;

    std::size_t i = 0, pos = 0;
    for (char c : line) {
        if (state == START) {
            if (!std::isspace((unsigned char)c)) {
                if (c == '#') {
                    return result;
                } else {
                    state = KEY;
                    pos = i;
                }
            }
        } else if (state == KEY) {
            if (c == '=') {
                state = VALUE;
                result.first = std::string(line, pos, i);
                rtrim(result.first);
                pos = i + 1;
            } else if (c == '#') {
                break;
            }
        } else if (state == VALUE) {
            if (c == '#') {
                break;
            }
        } else {
            throw std::runtime_error("unknown state: " + std::to_string(state));
        }
        ++i;
    }

    if (state == KEY) {
        throw std::runtime_error("no value: " + line);
    } else if (state == VALUE) {
        result.second = std::string(line, pos, i);
        trim(result.second);
    }

    return result;
}